

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O3

int x509_rsa_pss_to_ctx(EVP_MD_CTX *ctx,X509_ALGOR *sigalg,EVP_PKEY *pkey)

{
  uint64_t uVar1;
  int iVar2;
  int iVar3;
  RSA_PSS_PARAMS *val;
  X509_ALGOR *a;
  EVP_MD *md;
  EVP_MD *md_00;
  undefined4 extraout_var;
  long lVar4;
  uint uVar5;
  uint64_t salt_len;
  EVP_PKEY_CTX *pctx;
  uint64_t local_40;
  EVP_PKEY_CTX *local_38;
  
  iVar2 = OBJ_obj2nid((ASN1_OBJECT *)sigalg->algorithm);
  if (iVar2 != 0x390) {
    __assert_fail("OBJ_obj2nid(sigalg->algorithm) == NID_rsassaPss",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                  ,0xd9,"int x509_rsa_pss_to_ctx(EVP_MD_CTX *, const X509_ALGOR *, EVP_PKEY *)");
  }
  val = rsa_pss_decode((X509_ALGOR *)sigalg->parameter);
  if (val == (RSA_PSS_PARAMS *)0x0) {
    iVar2 = 0xe1;
  }
  else {
    if (val->maskGenAlgorithm == (X509_ALGOR *)0x0) {
      iVar2 = 0x8e;
LAB_0031512b:
      md = (EVP_MD *)0x0;
      ERR_put_error(0xb,0,0x70,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                    ,iVar2);
    }
    else {
      a = (X509_ALGOR *)rsa_mgf1_decode(val->maskGenAlgorithm);
      if (a == (X509_ALGOR *)0x0) {
        iVar2 = 0x94;
        goto LAB_0031512b;
      }
      md = (EVP_MD *)rsa_algor_to_md((X509_ALGOR *)a);
      X509_ALGOR_free(a);
    }
    md_00 = (EVP_MD *)rsa_algor_to_md(val->hashAlgorithm);
    uVar5 = 0;
    if ((md == (EVP_MD *)0x0) || (md_00 == (EVP_MD *)0x0)) goto LAB_00315263;
    if (md == md_00) {
      local_40 = 0;
      iVar2 = 0xf7;
      if (val->saltLength != (ASN1_INTEGER *)0x0) {
        iVar2 = ASN1_INTEGER_get_uint64(&local_40,val->saltLength);
        uVar1 = local_40;
        if (iVar2 == 0) {
          iVar2 = 0xf7;
        }
        else {
          iVar3 = EVP_MD_size(md_00);
          iVar2 = 0xf7;
          if (uVar1 == CONCAT44(extraout_var,iVar3)) {
            if (local_40 >> 0x1f != 0) {
              __assert_fail("salt_len <= INT_MAX",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                            ,0xfa,
                            "int x509_rsa_pss_to_ctx(EVP_MD_CTX *, const X509_ALGOR *, EVP_PKEY *)")
              ;
            }
            if ((ASN1_INTEGER *)val->trailerField != (ASN1_INTEGER *)0x0) {
              lVar4 = ASN1_INTEGER_get((ASN1_INTEGER *)val->trailerField);
              iVar2 = 0x101;
              if (lVar4 != 1) goto LAB_0031525e;
            }
            iVar2 = EVP_DigestVerifyInit
                              ((EVP_MD_CTX *)ctx,(EVP_PKEY_CTX **)&local_38,md_00,(ENGINE *)0x0,
                               (EVP_PKEY *)pkey);
            uVar5 = 0;
            if ((iVar2 != 0) &&
               (iVar2 = EVP_PKEY_CTX_set_rsa_padding(local_38,6), uVar5 = 0, iVar2 != 0)) {
              iVar2 = EVP_PKEY_CTX_set_rsa_pss_saltlen(local_38,(int)local_40);
              if (iVar2 != 0) {
                iVar2 = EVP_PKEY_CTX_set_rsa_mgf1_md(local_38,(EVP_MD *)md);
                uVar5 = (uint)(iVar2 != 0);
              }
            }
            goto LAB_00315263;
          }
        }
      }
    }
    else {
      iVar2 = 0xed;
    }
  }
LAB_0031525e:
  ERR_put_error(0xb,0,0x70,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                ,iVar2);
  uVar5 = 0;
LAB_00315263:
  ASN1_item_free((ASN1_VALUE *)val,(ASN1_ITEM *)&RSA_PSS_PARAMS_it);
  return uVar5;
}

Assistant:

int x509_rsa_pss_to_ctx(EVP_MD_CTX *ctx, const X509_ALGOR *sigalg,
                        EVP_PKEY *pkey) {
  assert(OBJ_obj2nid(sigalg->algorithm) == NID_rsassaPss);

  // Decode PSS parameters
  int ret = 0;
  RSA_PSS_PARAMS *pss = rsa_pss_decode(sigalg);

  {
    if (pss == NULL) {
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
      goto err;
    }

    const EVP_MD *mgf1md = rsa_mgf1_to_md(pss->maskGenAlgorithm);
    const EVP_MD *md = rsa_algor_to_md(pss->hashAlgorithm);
    if (mgf1md == NULL || md == NULL) {
      goto err;
    }

    // We require the MGF-1 and signing hashes to match.
    if (mgf1md != md) {
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
      goto err;
    }

    // We require the salt length be the hash length. The DEFAULT value is 20,
    // but this does not match any supported salt length.
    uint64_t salt_len = 0;
    if (pss->saltLength == NULL ||
        !ASN1_INTEGER_get_uint64(&salt_len, pss->saltLength) ||
        salt_len != EVP_MD_size(md)) {
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
      goto err;
    }
    assert(salt_len <= INT_MAX);

    // The trailer field must be 1 (0xbc). This value is DEFAULT, so the
    // structure is required to omit it in DER. Although a syntax error, we also
    // tolerate an explicitly-encoded value. See the certificates in
    // cl/362617931.
    if (pss->trailerField != NULL && ASN1_INTEGER_get(pss->trailerField) != 1) {
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
      goto err;
    }

    EVP_PKEY_CTX *pctx;
    if (!EVP_DigestVerifyInit(ctx, &pctx, md, NULL, pkey) ||
        !EVP_PKEY_CTX_set_rsa_padding(pctx, RSA_PKCS1_PSS_PADDING) ||
        !EVP_PKEY_CTX_set_rsa_pss_saltlen(pctx, (int)salt_len) ||
        !EVP_PKEY_CTX_set_rsa_mgf1_md(pctx, mgf1md)) {
      goto err;
    }

    ret = 1;
  }

err:
  RSA_PSS_PARAMS_free(pss);
  return ret;
}